

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makelevelset3.cpp
# Opt level: O0

int orientation(double x1,double y1,double x2,double y2,double *twice_signed_area)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double *twice_signed_area_local;
  double y2_local;
  double x2_local;
  double y1_local;
  double x1_local;
  undefined4 local_4;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = y1;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = x2;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = -(x1 * y2);
  auVar1 = vfmadd213sd_fma(auVar1,auVar2,auVar3);
  *twice_signed_area = auVar1._0_8_;
  if (*twice_signed_area <= 0.0) {
    if (0.0 <= *twice_signed_area) {
      if (y2 <= y1) {
        if (y1 <= y2) {
          if (x1 <= x2) {
            if (x2 <= x1) {
              local_4 = 0;
            }
            else {
              local_4 = -1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int orientation(double x1, double y1, double x2, double y2, double &twice_signed_area)
{
   twice_signed_area=y1*x2-x1*y2;
   if(twice_signed_area>0) return 1;
   else if(twice_signed_area<0) return -1;
   else if(y2>y1) return 1;
   else if(y2<y1) return -1;
   else if(x1>x2) return 1;
   else if(x1<x2) return -1;
   else return 0; // only true when x1==x2 and y1==y2
}